

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

char * aiScene::GetShortFilename(char *filename)

{
  char *local_28;
  char *shortFilename;
  char *lastSlash;
  char *filename_local;
  
  shortFilename = strrchr(filename,0x2f);
  if (shortFilename == (char *)0x0) {
    shortFilename = strrchr(filename,0x5c);
  }
  local_28 = filename;
  if (shortFilename != (char *)0x0) {
    local_28 = shortFilename + 1;
  }
  return local_28;
}

Assistant:

static const char* GetShortFilename(const char* filename) {
        const char* lastSlash = strrchr(filename, '/');
        if (lastSlash == nullptr) {
            lastSlash = strrchr(filename, '\\');
        }
        const char* shortFilename = lastSlash != nullptr ? lastSlash + 1 : filename;
        return shortFilename;
    }